

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void freeast(ast *root)

{
  value *__ptr;
  
  if (root != (ast *)0x0) {
    if (root->left != (ast *)0x0) {
      freeast(root->left);
    }
    root->left = (ast *)0x0;
    if (root->right != (ast *)0x0) {
      freeast(root->right);
    }
    root->right = (ast *)0x0;
    __ptr = root->val;
    if (__ptr != (value *)0x0) {
      if (root->type == 0x11c) {
        free(__ptr->typeval);
        root->val->numval = 0;
        __ptr = root->val;
      }
      free(__ptr);
      root->val = (value *)0x0;
    }
    free(root->pos);
    free(root);
    return;
  }
  return;
}

Assistant:

void freeast(struct ast *root) {
    if (!root) return;
    if (root->left) freeast(root->left);
    root->left = NULL;
    if (root->right) freeast(root->right);
    root->right = NULL;
    if (root->val) {
        if (root->type == ID) {
            free(root->val->idval);
            root->val->idval = NULL;
        }
        free(root->val);
        root->val = NULL;
    }
    if (root->pos) {
        free(root->pos);
        root->pos = NULL;
    }
    free(root);
}